

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_iterate(roaring_bitmap_t *r,roaring_iterator iterator,void *ptr)

{
  ushort uVar1;
  uint8_t uVar2;
  _Bool _Var3;
  long lVar4;
  int *piVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  if (0 < (r->high_low_container).size) {
    lVar4 = 0;
    do {
      piVar5 = (int *)(r->high_low_container).containers[lVar4];
      uVar2 = (r->high_low_container).typecodes[lVar4];
      uVar1 = (r->high_low_container).keys[lVar4];
      if (uVar2 == '\x04') {
        uVar2 = (uint8_t)piVar5[2];
        if (uVar2 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        piVar5 = *(int **)piVar5;
      }
      uVar8 = (uint)uVar1 << 0x10;
      if (uVar2 == '\x03') {
        if (0 < *piVar5) {
          lVar11 = 0;
          do {
            uVar6 = CONCAT22(uVar1,*(undefined2 *)(*(long *)(piVar5 + 2) + lVar11 * 4));
            iVar9 = *(ushort *)(*(long *)(piVar5 + 2) + 2 + lVar11 * 4) + 1;
            do {
              _Var3 = (*iterator)(uVar6,ptr);
              if (!_Var3) {
                return false;
              }
              uVar6 = uVar6 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
            lVar11 = lVar11 + 1;
          } while (lVar11 < *piVar5);
        }
      }
      else if (uVar2 == '\x02') {
        if (0 < *piVar5) {
          lVar11 = 0;
          do {
            _Var3 = (*iterator)(CONCAT22(uVar1,*(undefined2 *)(*(long *)(piVar5 + 2) + lVar11 * 2)),
                                ptr);
            if (!_Var3) {
              return false;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < *piVar5);
        }
      }
      else {
        if (uVar2 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x17e9,
                        "_Bool container_iterate(const container_t *, uint8_t, uint32_t, roaring_iterator, void *)"
                       );
        }
        uVar7 = 0;
        bVar12 = false;
        do {
          uVar10 = *(ulong *)(*(long *)(piVar5 + 2) + uVar7 * 8);
          while (uVar10 != 0) {
            lVar11 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            _Var3 = (*iterator)((uint)lVar11 | uVar8,ptr);
            uVar10 = uVar10 & uVar10 - 1;
            if (!_Var3) {
              if (!bVar12) {
                return false;
              }
              goto LAB_001136c6;
            }
          }
          uVar8 = uVar8 + 0x40;
          bVar12 = 0x3fe < uVar7;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x400);
      }
LAB_001136c6:
      lVar4 = lVar4 + 1;
    } while (lVar4 < (r->high_low_container).size);
  }
  return true;
}

Assistant:

bool roaring_iterate(const roaring_bitmap_t *r, roaring_iterator iterator,
                     void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate(ra->containers[i], ra->typecodes[i],
                               ((uint32_t)ra->keys[i]) << 16,
                               iterator, ptr)) {
            return false;
        }
    return true;
}